

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

Dim * __thiscall
cnn::Conv1DWide::dim_forward(Conv1DWide *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  const_reference pvVar7;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  uint ocols;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ostream *in_stack_ffffffffffffffb0;
  
  sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar4 != 2) {
    std::operator<<((ostream *)&std::cerr,"Conv1DWide requires two inputs: ");
    poVar5 = cnn::operator<<(in_stack_ffffffffffffffb0,
                             (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Conv1DWide requires two inputs");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar7 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar1 = Dim::cols(pvVar7);
  pvVar7 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
  uVar2 = Dim::cols(pvVar7);
  iVar3 = uVar1 + uVar2;
  pvVar7 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar2 = Dim::ndims(pvVar7);
  if (uVar2 == 2) {
    pvVar7 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
    uVar2 = Dim::ndims(pvVar7);
    if (uVar2 == 2) {
      pvVar7 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      in_stack_ffffffffffffffa8 = Dim::rows(pvVar7);
      pvVar7 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
      uVar2 = Dim::rows(pvVar7);
      if (in_stack_ffffffffffffffa8 == uVar2) {
        pvVar7 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
        uVar1 = Dim::rows(pvVar7);
        x._M_array._4_4_ = iVar3 + -1;
        x._M_array._0_4_ = uVar1;
        x._M_len = (size_type)&stack0xffffffffffffffc8;
        Dim::Dim(in_RDI,x);
        return in_RDI;
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad input dimensions in Conv1DWide: ");
  poVar5 = cnn::operator<<(in_stack_ffffffffffffffb0,
                           (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)
                           CONCAT44(uVar1,in_stack_ffffffffffffffa8));
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"bad input dimensions in Conv1DWide");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Conv1DWide::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2) {
    cerr << "Conv1DWide requires two inputs: " << xs << endl;
    throw std::invalid_argument("Conv1DWide requires two inputs");
  }
  unsigned ocols = xs[0].cols() + xs[1].cols() - 1;
  if (xs[0].ndims() != 2 || xs[1].ndims() != 2 ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad input dimensions in Conv1DWide: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in Conv1DWide");
  }
  return Dim({xs[0].rows(), ocols});
}